

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles31::Functional::createTextureBufferTests(Context *context)

{
  ModifyBits MVar1;
  ModifyBits MVar2;
  size_t sVar3;
  RenderBits RVar4;
  TestCaseGroup *this;
  TestCaseGroup *pTVar5;
  LimitQueryCase *pLVar6;
  AlignmentQueryCase *pAVar7;
  TextureBufferBindingQueryCase *pTVar8;
  TextureBindingBufferQueryCase *pTVar9;
  TextureBufferDataStoreQueryCase *pTVar10;
  TextureBufferOffsetQueryCase *pTVar11;
  TextureBufferSizeQueryCase *pTVar12;
  char *pcVar13;
  TextureBufferCase *pTVar14;
  TestContext *pTVar15;
  RenderContext *pRVar16;
  char *pcVar17;
  RenderBits renderBits;
  ModifyBits modifyBits;
  ModifyBits modifyBits_00;
  RenderBits renderBits_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar18;
  undefined8 extraout_RDX_02;
  undefined1 auVar19 [12];
  undefined1 local_500 [8];
  string name_7;
  size_t size_7;
  int local_4d0;
  ModifyBits modifyType_2;
  int modifyNdx_2;
  string local_4a8;
  TestCaseGroup *local_488;
  TestCaseGroup *renderTypeGroup_1;
  RenderBits renderType_2;
  int renderTypeNdx_2;
  TestCaseGroup *renderModifyGroup;
  string name_6;
  size_t size_6;
  int local_440;
  RenderBits renderType_1;
  int renderTypeNdx_1;
  string local_418;
  TestCaseGroup *local_3f8;
  TestCaseGroup *modifyTypeGroup_1;
  ModifyBits modifyType_1;
  int modifyNdx_1;
  TestCaseGroup *modifyRenderGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  undefined1 local_3a0 [8];
  string name_5;
  size_t size_5;
  size_t bufferSize_3;
  size_t offset_1;
  undefined8 uStack_360;
  int offsetNdx_1;
  size_t bufferSize_2;
  undefined1 local_338 [8];
  string name_4;
  size_t size_4;
  undefined1 local_308 [4];
  int sizeNdx_3;
  undefined1 local_2e8 [8];
  string name_3;
  size_t size_3;
  int sizeNdx_2;
  string local_298;
  TestCaseGroup *local_278;
  TestCaseGroup *modifyTypeGroup;
  ModifyBits modifyType;
  int modifyNdx;
  TestCaseGroup *modifyGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  string name_2;
  size_t size_2;
  size_t bufferSize_1;
  size_t offset;
  undefined8 uStack_1e0;
  int offsetNdx;
  size_t bufferSize;
  undefined1 local_1b8 [8];
  string name_1;
  size_t size_1;
  undefined1 local_188 [4];
  int sizeNdx_1;
  undefined1 local_168 [8];
  string name;
  size_t size;
  int sizeNdx;
  string local_118;
  TestCaseGroup *local_f8;
  TestCaseGroup *renderTypeGroup;
  RenderBits renderType;
  int renderTypeNdx;
  TestCaseGroup *renderGroup;
  TestCaseGroup *queryGroup;
  ModifyBits modifyTypes [4];
  RenderBits renderTypeCombinations [15];
  size_t offsets [2];
  size_t rangeSizes [4];
  size_t bufferSizes [5];
  TestCaseGroup *root;
  Context *context_local;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,context,"texture_buffer","Texture buffer syncronization tests");
  rangeSizes[3] = 0x200;
  rangeSizes[1] = 0x10001;
  rangeSizes[2] = 0x18000;
  offsets[1] = 0x200;
  rangeSizes[0] = 0x201;
  stack0xffffffffffffff78 = 1;
  offsets[0] = 7;
  modifyTypes[2] = MODIFYBITS_BUFFERDATA;
  modifyTypes[3] = MODIFYBITS_BUFFERSUBDATA;
  renderTypeCombinations[0] =
       anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_INDEX_ARRAY);
  renderTypeCombinations[1] = RENDERBITS_AS_VERTEX_TEXTURE;
  renderTypeCombinations[2] =
       anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_VERTEX_TEXTURE);
  renderTypeCombinations[3] =
       anon_unknown_1::operator|(RENDERBITS_AS_INDEX_ARRAY,RENDERBITS_AS_VERTEX_TEXTURE);
  RVar4 = anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_INDEX_ARRAY);
  renderTypeCombinations[4] = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_VERTEX_TEXTURE);
  renderTypeCombinations[5] = RENDERBITS_AS_FRAGMENT_TEXTURE;
  renderTypeCombinations[6] =
       anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_FRAGMENT_TEXTURE);
  renderTypeCombinations[7] =
       anon_unknown_1::operator|(RENDERBITS_AS_INDEX_ARRAY,RENDERBITS_AS_FRAGMENT_TEXTURE);
  RVar4 = anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_INDEX_ARRAY);
  renderTypeCombinations[8] = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_FRAGMENT_TEXTURE);
  renderTypeCombinations[9] =
       anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_TEXTURE,RENDERBITS_AS_FRAGMENT_TEXTURE);
  RVar4 = anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_VERTEX_TEXTURE);
  renderTypeCombinations[10] = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_FRAGMENT_TEXTURE);
  RVar4 = anon_unknown_1::operator|(RENDERBITS_AS_INDEX_ARRAY,RENDERBITS_AS_VERTEX_TEXTURE);
  renderTypeCombinations[0xb] = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_FRAGMENT_TEXTURE);
  RVar4 = anon_unknown_1::operator|(RENDERBITS_AS_VERTEX_ARRAY,RENDERBITS_AS_INDEX_ARRAY);
  RVar4 = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_VERTEX_TEXTURE);
  renderTypeCombinations[0xc] = anon_unknown_1::operator|(RVar4,RENDERBITS_AS_FRAGMENT_TEXTURE);
  queryGroup = (TestCaseGroup *)0x200000001;
  modifyTypes[0] = MODIFYBITS_MAPBUFFER_WRITE;
  modifyTypes[1] = MODIFYBITS_MAPBUFFER_READWRITE;
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar5,context,"state_query","Query states and limits");
  renderGroup = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  pTVar5 = renderGroup;
  pLVar6 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar6,context,"max_texture_buffer_size_getboolean","Test MAX_TEXTURE_BUFFER_SIZE",
             0x8c2b,0x10000,QUERY_BOOLEAN);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pLVar6);
  pTVar5 = renderGroup;
  pLVar6 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar6,context,"max_texture_buffer_size_getinteger","Test MAX_TEXTURE_BUFFER_SIZE",
             0x8c2b,0x10000,QUERY_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pLVar6);
  pTVar5 = renderGroup;
  pLVar6 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar6,context,"max_texture_buffer_size_getinteger64","Test MAX_TEXTURE_BUFFER_SIZE",
             0x8c2b,0x10000,QUERY_INTEGER64);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pLVar6);
  pTVar5 = renderGroup;
  pLVar6 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar6,context,"max_texture_buffer_size_getfloat","Test MAX_TEXTURE_BUFFER_SIZE",0x8c2b
             ,0x10000,QUERY_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pLVar6);
  pTVar5 = renderGroup;
  pAVar7 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar7,context,"texture_buffer_offset_alignment_getboolean",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",0x919f,0x100,QUERY_BOOLEAN);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pAVar7);
  pTVar5 = renderGroup;
  pAVar7 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar7,context,"texture_buffer_offset_alignment_getinteger",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",0x919f,0x100,QUERY_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pAVar7);
  pTVar5 = renderGroup;
  pAVar7 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar7,context,"texture_buffer_offset_alignment_getinteger64",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",0x919f,0x100,QUERY_INTEGER64);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pAVar7);
  pTVar5 = renderGroup;
  pAVar7 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar7,context,"texture_buffer_offset_alignment_getfloat",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",0x919f,0x100,QUERY_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pAVar7);
  pTVar5 = renderGroup;
  pTVar8 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar8,context,"texture_buffer_binding_getboolean","TEXTURE_BUFFER_BINDING",
             QUERY_BOOLEAN);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar8);
  pTVar5 = renderGroup;
  pTVar8 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar8,context,"texture_buffer_binding_getinteger","TEXTURE_BUFFER_BINDING",
             QUERY_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar8);
  pTVar5 = renderGroup;
  pTVar8 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar8,context,"texture_buffer_binding_getinteger64","TEXTURE_BUFFER_BINDING",
             QUERY_INTEGER64);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar8);
  pTVar5 = renderGroup;
  pTVar8 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar8,context,"texture_buffer_binding_getfloat","TEXTURE_BUFFER_BINDING",QUERY_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar8);
  pTVar5 = renderGroup;
  pTVar9 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar9,context,"texture_binding_buffer_getboolean","TEXTURE_BINDING_BUFFER",
             QUERY_BOOLEAN);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar9);
  pTVar5 = renderGroup;
  pTVar9 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar9,context,"texture_binding_buffer_getinteger","TEXTURE_BINDING_BUFFER",
             QUERY_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar9);
  pTVar5 = renderGroup;
  pTVar9 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar9,context,"texture_binding_buffer_getinteger64","TEXTURE_BINDING_BUFFER",
             QUERY_INTEGER64);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar9);
  pTVar5 = renderGroup;
  pTVar9 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar9,context,"texture_binding_buffer_getfloat","TEXTURE_BINDING_BUFFER",QUERY_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar9);
  pTVar5 = renderGroup;
  pTVar10 = (TextureBufferDataStoreQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferDataStoreQueryCase::TextureBufferDataStoreQueryCase
            (pTVar10,context,"texture_buffer_data_store_binding_integer",
             "TEXTURE_BUFFER_DATA_STORE_BINDING",QUERY_TEXTURE_LEVEL_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar10);
  pTVar5 = renderGroup;
  pTVar10 = (TextureBufferDataStoreQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferDataStoreQueryCase::TextureBufferDataStoreQueryCase
            (pTVar10,context,"texture_buffer_data_store_binding_float",
             "TEXTURE_BUFFER_DATA_STORE_BINDING",QUERY_TEXTURE_LEVEL_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar10);
  pTVar5 = renderGroup;
  pTVar11 = (TextureBufferOffsetQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferOffsetQueryCase::TextureBufferOffsetQueryCase
            (pTVar11,context,"texture_buffer_offset_integer","TEXTURE_BUFFER_OFFSET",
             QUERY_TEXTURE_LEVEL_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar11);
  pTVar5 = renderGroup;
  pTVar11 = (TextureBufferOffsetQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferOffsetQueryCase::TextureBufferOffsetQueryCase
            (pTVar11,context,"texture_buffer_offset_float","TEXTURE_BUFFER_OFFSET",
             QUERY_TEXTURE_LEVEL_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar11);
  pTVar5 = renderGroup;
  pTVar12 = (TextureBufferSizeQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferSizeQueryCase::TextureBufferSizeQueryCase
            (pTVar12,context,"texture_buffer_size_integer","TEXTURE_BUFFER_SIZE",
             QUERY_TEXTURE_LEVEL_INTEGER);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar12);
  pTVar5 = renderGroup;
  pTVar12 = (TextureBufferSizeQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferSizeQueryCase::TextureBufferSizeQueryCase
            (pTVar12,context,"texture_buffer_size_float","TEXTURE_BUFFER_SIZE",
             QUERY_TEXTURE_LEVEL_FLOAT);
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar12);
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,context,"render",
             "Setup texture buffer with glBufferData and render data in different ways");
  _renderType = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (renderTypeGroup._4_4_ = 0; renderTypeGroup._4_4_ < 0xf;
      renderTypeGroup._4_4_ = renderTypeGroup._4_4_ + 1) {
    renderTypeGroup._0_4_ = modifyTypes[(long)renderTypeGroup._4_4_ + 2];
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)(ulong)(ModifyBits)renderTypeGroup,renderBits);
    auVar19 = std::__cxx11::string::c_str();
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&sizeNdx,(_anonymous_namespace_ *)(ulong)(ModifyBits)renderTypeGroup,
               auVar19._8_4_);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar5,context,auVar19._0_8_,pcVar13);
    std::__cxx11::string::~string((string *)&sizeNdx);
    std::__cxx11::string::~string((string *)&local_118);
    local_f8 = pTVar5;
    tcu::TestNode::addChild((TestNode *)_renderType,(TestNode *)pTVar5);
    for (size._0_4_ = 0; (int)size < 5; size._0_4_ = (int)size + 1) {
      name.field_2._8_8_ = rangeSizes[(long)(int)size + 3];
      de::toString<unsigned_long>
                ((string *)local_188,(unsigned_long *)(name.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     "buffer_size_",(string *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      pTVar5 = local_f8;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)renderTypeGroup;
      uVar18 = name.field_2._8_8_;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,uVar18,0,0,RENDERBITS_NONE,MODIFYBITS_NONE,MVar1,
                 pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_168);
    }
    for (size_1._4_4_ = 0; size_1._4_4_ < 4; size_1._4_4_ = size_1._4_4_ + 1) {
      name_1.field_2._8_8_ = offsets[(long)size_1._4_4_ + 1];
      de::toString<unsigned_long>
                ((string *)&bufferSize,(unsigned_long *)(name_1.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "range_size_",(string *)&bufferSize);
      std::__cxx11::string::~string((string *)&bufferSize);
      pTVar5 = local_f8;
      uStack_1e0 = 0x20000;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)renderTypeGroup;
      uVar18 = name_1.field_2._8_8_;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x20000,0,uVar18,RENDERBITS_NONE,MODIFYBITS_NONE,
                 MVar1,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    for (offset._4_4_ = 0; offset._4_4_ < 2; offset._4_4_ = offset._4_4_ + 1) {
      bufferSize_1 = *(size_t *)(renderTypeCombinations + (long)offset._4_4_ * 2 + 0xe);
      name_2.field_2._8_8_ = 0x10001;
      de::toString<unsigned_long>((string *)&modifyGroup,&bufferSize_1);
      std::operator+(&local_240,"offset_",(string *)&modifyGroup);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     &local_240,"_alignments");
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&modifyGroup);
      pTVar5 = local_f8;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)renderTypeGroup;
      sVar3 = bufferSize_1;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x20000,sVar3,0x10001,RENDERBITS_NONE,
                 MODIFYBITS_NONE,MVar1,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_220);
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,context,"modify","Modify texture buffer content in multiple ways");
  _modifyType = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (modifyTypeGroup._4_4_ = 0; modifyTypeGroup._4_4_ < 4;
      modifyTypeGroup._4_4_ = modifyTypeGroup._4_4_ + 1) {
    modifyTypeGroup._0_4_ = modifyTypes[(long)modifyTypeGroup._4_4_ + -2];
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_298,(_anonymous_namespace_ *)(ulong)(ModifyBits)modifyTypeGroup,modifyBits);
    auVar19 = std::__cxx11::string::c_str();
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&sizeNdx_2,(_anonymous_namespace_ *)(ulong)(ModifyBits)modifyTypeGroup,
               auVar19._8_4_);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar5,context,auVar19._0_8_,pcVar13);
    std::__cxx11::string::~string((string *)&sizeNdx_2);
    std::__cxx11::string::~string((string *)&local_298);
    local_278 = pTVar5;
    tcu::TestNode::addChild((TestNode *)_modifyType,(TestNode *)pTVar5);
    for (size_3._0_4_ = 0; (int)size_3 < 5; size_3._0_4_ = (int)size_3 + 1) {
      name_3.field_2._8_8_ = rangeSizes[(long)(int)size_3 + 3];
      de::toString<unsigned_long>
                ((string *)local_308,(unsigned_long *)(name_3.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     "buffer_size_",(string *)local_308);
      std::__cxx11::string::~string((string *)local_308);
      pTVar5 = local_278;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)modifyTypeGroup;
      uVar18 = name_3.field_2._8_8_;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,uVar18,0,0,RENDERBITS_NONE,MVar1,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_2e8);
    }
    for (size_4._4_4_ = 0; size_4._4_4_ < 4; size_4._4_4_ = size_4._4_4_ + 1) {
      name_4.field_2._8_8_ = offsets[(long)size_4._4_4_ + 1];
      de::toString<unsigned_long>
                ((string *)&bufferSize_2,(unsigned_long *)(name_4.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "range_size_",(string *)&bufferSize_2);
      std::__cxx11::string::~string((string *)&bufferSize_2);
      pTVar5 = local_278;
      uStack_360 = 0x20000;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)modifyTypeGroup;
      uVar18 = name_4.field_2._8_8_;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x20000,0,uVar18,RENDERBITS_NONE,MVar1,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_338);
    }
    for (offset_1._4_4_ = 0; offset_1._4_4_ < 2; offset_1._4_4_ = offset_1._4_4_ + 1) {
      bufferSize_3 = *(size_t *)(renderTypeCombinations + (long)offset_1._4_4_ * 2 + 0xe);
      name_5.field_2._8_8_ = 0x10001;
      de::toString<unsigned_long>((string *)&modifyRenderGroup,&bufferSize_3);
      std::operator+(&local_3c0,"offset_",(string *)&modifyRenderGroup);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                     &local_3c0,"_alignments");
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&modifyRenderGroup);
      pTVar5 = local_278;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar1 = (ModifyBits)modifyTypeGroup;
      sVar3 = bufferSize_3;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x20000,sVar3,0x10001,RENDERBITS_NONE,MVar1,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_3a0);
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,context,"modify_render",
             "Modify texture buffer content in multiple ways and render in different ways");
  _modifyType_1 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (modifyTypeGroup_1._4_4_ = 0; modifyTypeGroup_1._4_4_ < 4;
      modifyTypeGroup_1._4_4_ = modifyTypeGroup_1._4_4_ + 1) {
    modifyTypeGroup_1._0_4_ = modifyTypes[(long)modifyTypeGroup_1._4_4_ + -2];
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_418,(_anonymous_namespace_ *)(ulong)(ModifyBits)modifyTypeGroup_1,
               modifyBits_00);
    auVar19 = std::__cxx11::string::c_str();
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&renderTypeNdx_1,
               (_anonymous_namespace_ *)(ulong)(ModifyBits)modifyTypeGroup_1,auVar19._8_4_);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar5,context,auVar19._0_8_,pcVar13);
    std::__cxx11::string::~string((string *)&renderTypeNdx_1);
    std::__cxx11::string::~string((string *)&local_418);
    local_3f8 = pTVar5;
    tcu::TestNode::addChild((TestNode *)_modifyType_1,(TestNode *)pTVar5);
    uVar18 = extraout_RDX;
    for (local_440 = 0; local_440 < 0xf; local_440 = local_440 + 1) {
      MVar1 = modifyTypes[(long)local_440 + 2];
      name_6.field_2._8_8_ = 0x4000;
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)&renderModifyGroup,(_anonymous_namespace_ *)(ulong)MVar1,
                 (RenderBits)uVar18);
      pTVar5 = local_3f8;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar2 = (ModifyBits)modifyTypeGroup_1;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x4000,0,0,RENDERBITS_NONE,MVar2,MVar1,pcVar13,
                 pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)&renderModifyGroup);
      uVar18 = extraout_RDX_00;
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar5,context,"render_modify","Render texture buffer and modify.");
  _renderType_2 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (renderTypeGroup_1._4_4_ = 0; renderTypeGroup_1._4_4_ < 0xf;
      renderTypeGroup_1._4_4_ = renderTypeGroup_1._4_4_ + 1) {
    renderTypeGroup_1._0_4_ = modifyTypes[(long)renderTypeGroup_1._4_4_ + 2];
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_4a8,(_anonymous_namespace_ *)(ulong)(ModifyBits)renderTypeGroup_1,
               renderBits_00);
    auVar19 = std::__cxx11::string::c_str();
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&modifyNdx_2,(_anonymous_namespace_ *)(ulong)(ModifyBits)renderTypeGroup_1,
               auVar19._8_4_);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar5,context,auVar19._0_8_,pcVar13);
    std::__cxx11::string::~string((string *)&modifyNdx_2);
    std::__cxx11::string::~string((string *)&local_4a8);
    local_488 = pTVar5;
    tcu::TestNode::addChild((TestNode *)_renderType_2,(TestNode *)pTVar5);
    uVar18 = extraout_RDX_01;
    for (local_4d0 = 0; local_4d0 < 4; local_4d0 = local_4d0 + 1) {
      MVar1 = modifyTypes[(long)local_4d0 + -2];
      name_7.field_2._8_8_ = 0x4000;
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)local_500,(_anonymous_namespace_ *)(ulong)MVar1,(ModifyBits)uVar18);
      pTVar5 = local_488;
      pTVar14 = (TextureBufferCase *)operator_new(0xb8);
      pTVar15 = gles31::Context::getTestContext(context);
      pRVar16 = gles31::Context::getRenderContext(context);
      MVar2 = (ModifyBits)renderTypeGroup_1;
      pcVar13 = (char *)std::__cxx11::string::c_str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      deqp::gls::TextureBufferCase::TextureBufferCase
                (pTVar14,pTVar15,pRVar16,0x8058,0x4000,0,0,MVar2,MVar1,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,pcVar13,pcVar17);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar14);
      std::__cxx11::string::~string((string *)local_500);
      uVar18 = extraout_RDX_02;
    }
  }
  return this;
}

Assistant:

TestCaseGroup* createTextureBufferTests (Context& context)
{
	TestCaseGroup* const root = new TestCaseGroup(context, "texture_buffer", "Texture buffer syncronization tests");

	const size_t bufferSizes[] =
	{
		512,
		513,
		65536,
		65537,
		131071
	};

	const size_t rangeSizes[] =
	{
		512,
		513,
		65537,
		98304,
	};

	const size_t offsets[] =
	{
		1,
		7
	};

	const RenderBits renderTypeCombinations[] =
	{
		RENDERBITS_AS_VERTEX_ARRAY,
									  RENDERBITS_AS_INDEX_ARRAY,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY,

																  RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,

																								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|															  RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
																  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE
	};

	const ModifyBits modifyTypes[] =
	{
		MODIFYBITS_BUFFERDATA,
		MODIFYBITS_BUFFERSUBDATA,
		MODIFYBITS_MAPBUFFER_WRITE,
		MODIFYBITS_MAPBUFFER_READWRITE
	};

	// State and limit queries
	{
		TestCaseGroup* const queryGroup = new TestCaseGroup(context, "state_query", "Query states and limits");
		root->addChild(queryGroup);

		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getboolean",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_BOOLEAN));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger64",			"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER64));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getfloat",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_FLOAT));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getboolean",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_BOOLEAN));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger64",	"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER64));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getfloat",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getboolean",	"TEXTURE_BUFFER_BINDING", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger64",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getfloat",		"TEXTURE_BUFFER_BINDING", QUERY_FLOAT));

		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getboolean",	"TEXTURE_BINDING_BUFFER", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger64",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getfloat",		"TEXTURE_BINDING_BUFFER", QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_integer",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_float",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_integer",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_float",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_integer",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_float",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_FLOAT));
	}

	// Rendering test
	{
		TestCaseGroup* const renderGroup = new TestCaseGroup(context, "render", "Setup texture buffer with glBufferData and render data in different ways");
		root->addChild(renderGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderGroup->addChild(renderTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t size	= bufferSizes[sizeNdx];
				const string name	("buffer_size_" + de::toString(size));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify tests
	{
		TestCaseGroup* const modifyGroup = new TestCaseGroup(context, "modify", "Modify texture buffer content in multiple ways");
		root->addChild(modifyGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyGroup->addChild(modifyTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t	size	= bufferSizes[sizeNdx];
				const string	name	("buffer_size_" + de::toString(size));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify-Render tests
	{
		TestCaseGroup* const modifyRenderGroup = new TestCaseGroup(context, "modify_render", "Modify texture buffer content in multiple ways and render in different ways");
		root->addChild(modifyRenderGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyRenderGroup->addChild(modifyTypeGroup);

			for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
			{
				const RenderBits	renderType	= renderTypeCombinations[renderTypeNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(renderType));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Render-Modify tests
	{
		TestCaseGroup* const renderModifyGroup = new TestCaseGroup(context, "render_modify", "Render texture buffer and modify.");
		root->addChild(renderModifyGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderModifyGroup->addChild(renderTypeGroup);

			for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
			{
				const ModifyBits	modifyType	= modifyTypes[modifyNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(modifyType));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, renderType, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	return root;
}